

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::ConstantTexture::readFrom(ConstantTexture *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  runtime_error *this_00;
  
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar1 + 0xc <=
      (ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2)) {
    (this->value).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->value).x = (float)(int)uVar3;
    (this->value).y = (float)(int)((ulong)uVar3 >> 0x20);
    binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"invalid read attempt by entity - not enough data in data block!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void copyBytes(T *t, size_t numBytes)
    {
      if ((currentEntityOffset + numBytes) > currentEntityData.size())
        throw std::runtime_error("invalid read attempt by entity - not enough data in data block!");
      memcpy((void *)t,(void *)((char*)currentEntityData.data()+currentEntityOffset),numBytes);
      currentEntityOffset += numBytes;
    }